

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static-var-tests.cpp
# Opt level: O1

void StaticVarsDumpToFile(bool *result)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint64_t staticMemSize;
  size_t staticMemCount;
  uint64_t local_20;
  size_t local_18;
  
  __static_mem_check(&local_18,&local_20,true,"staticvarsdump.log",false);
  iVar1 = countLinesInFile("staticvarsdump.log");
  if (iVar1 == 4) {
    __static_mem_check(&local_18,&local_20,true,"staticvarsdump.log",true);
    iVar1 = countLinesInFile("staticvarsdump.log");
    if (iVar1 != 8) {
      uVar2 = countLinesInFile("staticvarsdump.log");
      uVar3 = 0x58;
      uVar4 = 8;
      goto LAB_001026fd;
    }
    __static_mem_check(&local_18,&local_20,true,"staticvarsdump.log",false);
    iVar1 = countLinesInFile("staticvarsdump.log");
    if (iVar1 == 4) {
      return;
    }
    uVar2 = countLinesInFile("staticvarsdump.log");
    uVar3 = 0x5c;
  }
  else {
    uVar2 = countLinesInFile("staticvarsdump.log");
    uVar3 = 0x54;
  }
  uVar4 = 4;
LAB_001026fd:
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarsDumpToFile",
         uVar3,(ulong)uVar2,uVar4);
  *result = false;
  return;
}

Assistant:

TEST_CASE(StaticVarsDumpToFile) {

    size_t staticMemCount;
    uint64_t staticMemSize;
    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", false);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 4);

    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", true);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 8);

    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", false);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 4);
}